

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_NtkStopReverseLevels(Abc_Ntk_t *pNtk)

{
  Vec_Int_t *__ptr;
  
  __ptr = pNtk->vLevelsR;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    pNtk->vLevelsR = (Vec_Int_t *)0x0;
    pNtk->LevelMax = 0;
    return;
  }
  __assert_fail("pNtk->vLevelsR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                ,0x4ee,"void Abc_NtkStopReverseLevels(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkStopReverseLevels( Abc_Ntk_t * pNtk )
{
    assert( pNtk->vLevelsR );
    Vec_IntFree( pNtk->vLevelsR );
    pNtk->vLevelsR = NULL;
    pNtk->LevelMax = 0;

}